

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
carver::Carver::calculateLowestEnergyPath(Carver *this,Mat *source)

{
  Mat *pMVar1;
  _InputArray *p_Var2;
  reference pvVar3;
  int *piVar4;
  double *pdVar5;
  reference pvVar6;
  Carver *this_00;
  Mat *in_RDX;
  vector<int,_std::allocator<int>_> *in_RDI;
  int r;
  Mat lastRow;
  int minIdx;
  Point minIdxPoint;
  int delta;
  vector<double,_std::allocator<double>_> nextHops;
  vector<int,_std::allocator<int>_> *path;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int iVar7;
  _InputArray *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  size_type in_stack_fffffffffffffe48;
  double dVar8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  Mat *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe70;
  vector<double,_std::allocator<double>_> *this_01;
  int local_110 [9];
  int local_ec;
  int local_e8 [3];
  int local_dc;
  _InputArray local_d8;
  Mat local_c0 [100];
  value_type local_5c;
  Point_<int> local_58;
  int local_50;
  vector<double,_std::allocator<double>_> local_48;
  byte local_19;
  Mat *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::allocator<int>::allocator((allocator<int> *)0x114123);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  std::allocator<int>::~allocator((allocator<int> *)0x11414f);
  std::allocator<double>::allocator((allocator<double> *)0x114164);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  iVar7 = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  std::allocator<double>::~allocator((allocator<double> *)0x11418d);
  local_50 = 0;
  cv::Point_<int>::Point_(&local_58);
  cv::Mat::row(in_stack_fffffffffffffe58,iVar7);
  cv::_InputArray::_InputArray
            (in_stack_fffffffffffffe30,
             (Mat *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  p_Var2 = (_InputArray *)cv::noArray();
  cv::minMaxLoc(&local_d8,(double *)0x0,(double *)0x0,(Point_ *)&local_58,(Point_ *)0x0,p_Var2);
  cv::_InputArray::~_InputArray(&local_d8);
  local_5c = local_58.x;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (in_RDI,(long)(*(int *)(local_18 + 8) + -1));
  *pvVar3 = local_58.x;
  for (local_dc = *(int *)(local_18 + 8) + -2; pMVar1 = local_18, iVar7 = local_dc, -1 < local_dc;
      local_dc = local_dc + -1) {
    local_e8[2] = local_5c + -1;
    local_e8[1] = 0;
    piVar4 = std::max<int>(local_e8 + 2,local_e8 + 1);
    pdVar5 = cv::Mat::at<double>(pMVar1,iVar7,*piVar4);
    this_01 = (vector<double,_std::allocator<double>_> *)*pdVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,0);
    *pvVar6 = (value_type)this_01;
    pdVar5 = cv::Mat::at<double>(local_18,local_dc,local_5c);
    dVar8 = *pdVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,1);
    pMVar1 = local_18;
    *pvVar6 = dVar8;
    local_e8[0] = local_5c + 1;
    local_ec = *(int *)(local_18 + 0xc) + -1;
    iVar7 = local_dc;
    this_00 = (Carver *)std::min<int>(local_e8,&local_ec);
    pdVar5 = cv::Mat::at<double>(pMVar1,iVar7,*(int *)this_00);
    dVar8 = *pdVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,2);
    *pvVar6 = dVar8;
    std::vector<double,_std::allocator<double>_>::vector
              (this_01,(vector<double,_std::allocator<double>_> *)this_00);
    in_stack_fffffffffffffe44 =
         findMinOffset_(this_00,(vector<double,_std::allocator<double>_> *)
                                CONCAT44(iVar7,in_stack_fffffffffffffe70));
    local_50 = in_stack_fffffffffffffe44;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    local_5c = local_5c + local_50;
    local_110[1] = 0;
    piVar4 = std::max<int>(&local_5c,local_110 + 1);
    local_110[0] = *(int *)(local_18 + 0xc) + -1;
    piVar4 = std::min<int>(piVar4,local_110);
    iVar7 = *piVar4;
    local_5c = iVar7;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_dc);
    *pvVar3 = iVar7;
  }
  local_19 = 1;
  cv::Mat::~Mat(local_c0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  if ((local_19 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  return in_RDI;
}

Assistant:

vector<int> Carver::calculateLowestEnergyPath(cv::Mat &source) {
    vector<int> path(source.rows);
    vector<double> nextHops(3);
    int delta = 0;

    // Find the minimum of the last row, that is our starting point
    cv::Point minIdxPoint;
    int minIdx;
    cv::Mat lastRow = source.row(source.rows - 1);
    cv::minMaxLoc(lastRow, nullptr, nullptr, &minIdxPoint, nullptr);
    minIdx = minIdxPoint.x;
    path[source.rows - 1] = minIdx;

    for (int r = source.rows - 2; r >= 0; r--) {
        nextHops[0] = source.at<double>(r, max(minIdx - 1, 0));
        nextHops[1] = source.at<double>(r, minIdx);
        nextHops[2] = source.at<double>(r, min(minIdx + 1, source.cols - 1));

        delta = findMinOffset_(nextHops);

        // Add the discovered minimum index to our path, taking care
        // not to cross image boundaries
        minIdx += delta;
        minIdx = min(max(minIdx, 0), source.cols - 1);
        path[r] = minIdx;
    }

    return path;
}